

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O0

void gpc_sRGB(Pixel *out,Pixel *in,Background *back)

{
  byte bVar1;
  Background *back_local;
  Pixel *in_local;
  Pixel *out_local;
  
  bVar1 = isRGB(in->r);
  out->r = (uint)bVar1;
  if (in->g == in->r) {
    out->g = out->r;
    if (in->b == in->r) {
      out->b = out->r;
    }
    else {
      bVar1 = isRGB(in->b);
      out->b = (uint)bVar1;
    }
  }
  else {
    bVar1 = isRGB(in->g);
    out->g = (uint)bVar1;
    if (in->b == in->r) {
      out->b = out->r;
    }
    else if (in->b == in->g) {
      out->b = out->g;
    }
    else {
      bVar1 = isRGB(in->b);
      out->b = (uint)bVar1;
    }
  }
  out->a = 0xff;
  return;
}

Assistant:

static void
gpc_sRGB(Pixel *out, const Pixel *in, const Background *back)
{
   (void)back;

   out->r = isRGB(in->r);

   if (in->g == in->r)
   {
      out->g = out->r;

      if (in->b == in->r)
         out->b = out->r;

      else
         out->b = isRGB(in->b);
   }

   else
   {
      out->g = isRGB(in->g);

      if (in->b == in->r)
         out->b = out->r;

      else if (in->b == in->g)
         out->b = out->g;

      else
         out->b = isRGB(in->b);
   }

   out->a = 255;
}